

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager.cc
# Opt level: O0

void __thiscall MemoryManager::free(MemoryManager *this,void *__ptr)

{
  delete_ptr<Node> local_39;
  _List_node_base *local_38;
  _List_node_base *local_30;
  delete_ptr<Operation> local_21;
  _List_node_base *local_20;
  _List_node_base *local_18;
  MemoryManager *local_10;
  MemoryManager *this_local;
  
  local_10 = this;
  local_18 = (_List_node_base *)
             std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::begin
                       (&this->operations);
  local_20 = (_List_node_base *)
             std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::end
                       (&this->operations);
  anon_unknown.dwarf_c3f9::delete_ptr<Operation>::delete_ptr(&local_21);
  std::for_each<std::_List_iterator<Operation_const*>,(anonymous_namespace)::delete_ptr<Operation>>
            (local_18,local_20);
  local_30 = (_List_node_base *)
             std::__cxx11::list<const_Node_*,_std::allocator<const_Node_*>_>::begin(&this->nodes);
  local_38 = (_List_node_base *)
             std::__cxx11::list<const_Node_*,_std::allocator<const_Node_*>_>::end(&this->nodes);
  anon_unknown.dwarf_c3f9::delete_ptr<Node>::delete_ptr(&local_39);
  std::for_each<std::_List_iterator<Node_const*>,(anonymous_namespace)::delete_ptr<Node>>
            (local_30,local_38);
  std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::clear
            (&this->operations);
  std::__cxx11::list<const_Node_*,_std::allocator<const_Node_*>_>::clear(&this->nodes);
  return;
}

Assistant:

void MemoryManager::free()
{
	for_each(operations.begin(), operations.end(), delete_ptr<Operation>());
	for_each(nodes.begin(), nodes.end(), delete_ptr<Node>());
	operations.clear();
	nodes.clear();
}